

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int64_t hdr_value_at_index(hdr_histogram *h,int32_t index)

{
  int64_t iVar1;
  int32_t local_1c;
  int32_t local_18;
  int32_t sub_bucket_index;
  int32_t bucket_index;
  int32_t index_local;
  hdr_histogram *h_local;
  
  local_18 = (index >> ((byte)h->sub_bucket_half_count_magnitude & 0x1f)) + -1;
  local_1c = (index & h->sub_bucket_half_count - 1U) + h->sub_bucket_half_count;
  if (local_18 < 0) {
    local_1c = local_1c - h->sub_bucket_half_count;
    local_18 = 0;
  }
  iVar1 = value_from_index(local_18,local_1c,h->unit_magnitude);
  return iVar1;
}

Assistant:

int64_t hdr_value_at_index(const struct hdr_histogram *h, int32_t index)
{
    int32_t bucket_index = (index >> h->sub_bucket_half_count_magnitude) - 1;
    int32_t sub_bucket_index = (index & (h->sub_bucket_half_count - 1)) + h->sub_bucket_half_count;

    if (bucket_index < 0)
    {
        sub_bucket_index -= h->sub_bucket_half_count;
        bucket_index = 0;
    }

    return value_from_index(bucket_index, sub_bucket_index, h->unit_magnitude);
}